

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O3

char * deqp::gles3::Functional::DitheringCase::getPatternTypeName(PatternType type)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = (char *)0x0;
  if (type == PATTERNTYPE_UNICOLORED_QUAD) {
    pcVar2 = "unicolored_quad";
  }
  pcVar1 = "gradient";
  if (type != PATTERNTYPE_GRADIENT) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* DitheringCase::getPatternTypeName (const PatternType type)
{
	switch (type)
	{
		case PATTERNTYPE_GRADIENT:			return "gradient";
		case PATTERNTYPE_UNICOLORED_QUAD:	return "unicolored_quad";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}